

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::SetRootFuncInfo(ByteCodeGenerator *this,FuncInfo *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseableFunctionInfo *pPVar4;
  
  if ((this->pRootFunc != (ParseableFunctionInfo *)0x0) &&
     (this->pRootFunc != func->byteCodeFunction)) {
    bVar2 = Js::ScriptContext::IsScriptContextInNonDebugMode(this->scriptContext);
    if ((bVar2) || ((this->m_utf8SourceInfo->field_0xa8 & 4) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x32d,
                         "(pRootFunc == nullptr || pRootFunc == func->byteCodeFunction || !IsInNonDebugMode())"
                         ,
                         "pRootFunc == nullptr || pRootFunc == func->byteCodeFunction || !IsInNonDebugMode()"
                        );
      if (!bVar2) goto LAB_00820c2f;
      *puVar3 = 0;
    }
  }
  if (((this->flags & 4) != 0) && (this->parentScopeInfo == (ScopeInfo *)0x0)) {
    bVar2 = FuncInfo::IsGlobalFunction(func);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x333,"(!func->IsGlobalFunction())","!func->IsGlobalFunction()");
      if (!bVar2) {
LAB_00820c2f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    func->field_0xb4 = func->field_0xb4 | 0x20;
  }
  if (this->pRootFunc != (ParseableFunctionInfo *)0x0) {
    return;
  }
  pPVar4 = Js::FunctionProxy::GetParseableFunctionInfo(&func->byteCodeFunction->super_FunctionProxy)
  ;
  this->pRootFunc = pPVar4;
  Js::Utf8SourceInfo::AddTopLevelFunctionInfo
            (this->m_utf8SourceInfo,(func->byteCodeFunction->super_FunctionProxy).functionInfo.ptr,
             this->scriptContext->recycler);
  return;
}

Assistant:

void ByteCodeGenerator::SetRootFuncInfo(FuncInfo* func)
{
    Assert(pRootFunc == nullptr || pRootFunc == func->byteCodeFunction || !IsInNonDebugMode());

    if ((this->flags & fscrImplicitThis) && !this->HasParentScopeInfo())
    {
        // Mark a top-level event handler, since it will need to construct the "this" pointer's
        // namespace hierarchy to access globals.
        Assert(!func->IsGlobalFunction());
        func->SetIsTopLevelEventHandler(true);
    }

    if (pRootFunc)
    {
        return;
    }

    this->pRootFunc = func->byteCodeFunction->GetParseableFunctionInfo();
    this->m_utf8SourceInfo->AddTopLevelFunctionInfo(func->byteCodeFunction->GetFunctionInfo(), scriptContext->GetRecycler());
}